

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O0

int run_test_fork_threadpool_queue_work_simple(void)

{
  uint uVar1;
  int iVar2;
  uv_loop_t *puVar3;
  undefined8 uVar4;
  undefined1 local_360 [8];
  uv_loop_t loop;
  pid_t child_pid;
  
  puVar3 = (uv_loop_t *)uv_default_loop();
  assert_run_work(puVar3);
  loop._844_4_ = fork();
  if (loop._844_4_ == -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0x28d,"child_pid != -1");
    abort();
  }
  if (loop._844_4_ == 0) {
    uVar1 = getpid();
    printf("Running child in %d\n",(ulong)uVar1);
    uv_loop_init(local_360);
    printf("Child first watch\n");
    assert_run_work((uv_loop_t *)local_360);
    uv_loop_close(local_360);
    printf("Child second watch default loop\n");
    uVar4 = uv_default_loop();
    iVar2 = uv_loop_fork(uVar4);
    if (iVar2 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
              ,0x29c,"0 == uv_loop_fork(uv_default_loop())");
      abort();
    }
    puVar3 = (uv_loop_t *)uv_default_loop();
    assert_run_work(puVar3);
    printf("Exiting child \n");
  }
  else {
    puVar3 = (uv_loop_t *)uv_default_loop();
    assert_run_work(puVar3);
    assert_wait_child(loop._844_4_);
  }
  puVar3 = (uv_loop_t *)uv_default_loop();
  close_loop(puVar3);
  uVar4 = uv_default_loop();
  iVar2 = uv_loop_close(uVar4);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
            ,0x2a2,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(fork_threadpool_queue_work_simple) {
  /* The threadpool works in a child process. */

  pid_t child_pid;
  uv_loop_t loop;

  /* Prime the pool and default loop. */
  assert_run_work(uv_default_loop());

  child_pid = fork();
  ASSERT(child_pid != -1);

  if (child_pid != 0) {
    /* Parent. We can still run work. */
    assert_run_work(uv_default_loop());
    assert_wait_child(child_pid);
  } else {
    /* Child. We can work in a new loop. */
    printf("Running child in %d\n", getpid());
    uv_loop_init(&loop);
    printf("Child first watch\n");
    assert_run_work(&loop);
    uv_loop_close(&loop);
    printf("Child second watch default loop\n");
    /* We can work in the default loop. */
    ASSERT(0 == uv_loop_fork(uv_default_loop()));
    assert_run_work(uv_default_loop());
    printf("Exiting child \n");
  }


  MAKE_VALGRIND_HAPPY();
  return 0;
}